

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ParseInt32Flag(char *str,char *flag,int32_t *value)

{
  bool bVar1;
  char *str_00;
  size_t sVar2;
  ostream *poVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  
  bVar1 = false;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    Message::Message((Message *)&local_30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_30._M_head_impl + 0x10),"The value of flag --",0x14);
    poVar3 = (ostream *)(local_30._M_head_impl + 0x10);
    if (flag == (char *)0x0) {
      sVar2 = 6;
      flag = "(null)";
    }
    else {
      sVar2 = strlen(flag);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,flag,sVar2);
    bVar1 = ParseInt32((Message *)&local_30,str_00,value);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  return bVar1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}